

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

void __thiscall SqModules::resolveFileName(SqModules *this,char *requested_fn,string *res)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_t __n;
  ulong uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  char *in_RSI;
  bool exists;
  size_t reqFnLen;
  size_t locationLen;
  string *curFile;
  vector<char,_std::allocator<char>_> scriptPathBuf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  vector<char,_std::allocator<char>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  size_type __n_00;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff20;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff28;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  vector<char,_std::allocator<char>_> local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::clear();
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1d8996);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff00);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back(in_stack_fffffffffffffef0);
    std::__cxx11::string::length();
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
    std::__cxx11::string::c_str();
    dd_get_fname_location((char *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
    dd_append_slash_c((char *)in_stack_fffffffffffffef0);
    in_stack_ffffffffffffff38._M_current = (char *)&local_30;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff38._M_current,
                        0);
    __n = strlen(pvVar3);
    strlen(local_10);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff30._M_current = (char *)&local_30;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff30._M_current,
                        __n);
    strcpy(pvVar3,local_10);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff30._M_current,0);
    dd_simplify_fname_c(in_stack_ffffffffffffff20._M_current);
    in_stack_ffffffffffffff28._M_current = (char *)&local_30;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28._M_current,
                        0);
    strlen(pvVar3);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,0);
    iVar2 = access(pvVar3,0);
    if (iVar2 == 0) {
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffef0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff10 = &local_30;
      std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffee8);
      std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff20 =
           std::__cxx11::string::
           insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                     (in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff38,
                      in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    strlen(local_10);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __n_00 = 0;
    in_stack_ffffffffffffff00 = &local_30;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_stack_ffffffffffffff00,0);
    strcpy(pvVar3,local_10);
    std::vector<char,_std::allocator<char>_>::operator[](in_stack_ffffffffffffff00,__n_00);
    dd_simplify_fname_c(in_stack_ffffffffffffff20._M_current);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              (local_18,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffee8);
    this_00 = &local_30;
    std::vector<char,_std::allocator<char>_>::begin(this_00);
    std::vector<char,_std::allocator<char>_>::end(this_00);
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20._M_current,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void SqModules::resolveFileName(const char *requested_fn, string &res)
{
  res.clear();

  std::vector<char> scriptPathBuf;

  // try relative path first
  if (!runningScripts.empty())
  {
    const string &curFile = runningScripts.back();
    scriptPathBuf.resize(curFile.length()+2);
    dd_get_fname_location(&scriptPathBuf[0], curFile.c_str());
    dd_append_slash_c(&scriptPathBuf[0]);
    size_t locationLen = strlen(&scriptPathBuf[0]);
    size_t reqFnLen = strlen(requested_fn);
    scriptPathBuf.resize(locationLen + reqFnLen + 1);
    strcpy(&scriptPathBuf[locationLen], requested_fn);
    dd_simplify_fname_c(&scriptPathBuf[0]);
    scriptPathBuf.resize(strlen(&scriptPathBuf[0])+1);
    bool exists = _access(&scriptPathBuf[0], 0) == 0;
    if (exists)
      res.insert(res.end(), scriptPathBuf.begin(), scriptPathBuf.end());
  }

  if (res.empty())
  {
    scriptPathBuf.resize(strlen(requested_fn)+1);
    strcpy(&scriptPathBuf[0], requested_fn);
    dd_simplify_fname_c(&scriptPathBuf[0]);
    res.insert(res.end(), scriptPathBuf.begin(), scriptPathBuf.end());
  }
}